

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::CachedTxGetDebit(CWallet *wallet,CWalletTx *wtx,isminefilter *filter)

{
  bool bVar1;
  CAmount CVar2;
  uint *in_RDX;
  long in_FS_OFFSET;
  CWalletTx *unaff_retaddr;
  CWallet *in_stack_00000008;
  CAmount debit;
  isminefilter get_amount_filter;
  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffb8;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffffc8;
  long local_18;
  undefined4 in_stack_fffffffffffffff0;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffffb8);
  bVar1 = std::vector<CTxIn,_std::allocator<CTxIn>_>::empty(in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_18 = 0;
  }
  else {
    local_18 = 0;
    if ((*in_RDX & 3) != 0) {
      CVar2 = GetCachableAmount(in_stack_00000008,unaff_retaddr,(AmountType)((ulong)lVar3 >> 0x20),
                                (isminefilter *)
                                (CONCAT44(*in_RDX,in_stack_fffffffffffffff0) & 0x3ffffffff));
      local_18 = CVar2 + local_18;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

CAmount CachedTxGetDebit(const CWallet& wallet, const CWalletTx& wtx, const isminefilter& filter)
{
    if (wtx.tx->vin.empty())
        return 0;

    CAmount debit = 0;
    const isminefilter get_amount_filter{filter & ISMINE_ALL};
    if (get_amount_filter) {
        debit += GetCachableAmount(wallet, wtx, CWalletTx::DEBIT, get_amount_filter);
    }
    return debit;
}